

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> *this,
          SmallVector<diligent_spirv_cross::SPIRFunction::Parameter,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Parameter *pPVar4;
  Parameter *pPVar5;
  undefined8 uVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  
  if (this != other) {
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size = 0;
    reserve(this,(other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).
                 buffer_size);
    lVar7 = 0;
    for (uVar8 = 0;
        uVar3 = (other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size
        , uVar8 < uVar3; uVar8 = uVar8 + 1) {
      pPVar4 = (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).ptr;
      pPVar5 = (other->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).ptr;
      *(undefined4 *)(&pPVar4->alias_global_variable + lVar7) =
           *(undefined4 *)(&pPVar5->alias_global_variable + lVar7);
      puVar1 = (undefined8 *)((long)&(pPVar5->type).id + lVar7);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar4->type).id + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar7 = lVar7 + 0x14;
    }
    (this->super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>).buffer_size = uVar3;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}